

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void neg_shift_avx2(__m256i in0,__m256i in1,__m256i *out0,__m256i *out1,__m256i *clamp_lo,
                   __m256i *clamp_hi,int shift)

{
  undefined1 auVar1 [32];
  __m256i alVar2;
  __m256i alVar3;
  int iVar4;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar5 [32];
  
  iVar4 = (1 << ((byte)shift & 0x1f)) >> 1;
  auVar5._4_4_ = iVar4;
  auVar5._0_4_ = iVar4;
  auVar5._8_4_ = iVar4;
  auVar5._12_4_ = iVar4;
  auVar5._16_4_ = iVar4;
  auVar5._20_4_ = iVar4;
  auVar5._24_4_ = iVar4;
  auVar5._28_4_ = iVar4;
  auVar1 = vpaddd_avx2(auVar5,in_ZMM0._0_32_);
  auVar5 = vpsubd_avx2(auVar5,in_ZMM1._0_32_);
  auVar1 = vpsrad_avx2(auVar1,ZEXT416((uint)shift));
  auVar5 = vpsrad_avx2(auVar5,ZEXT416((uint)shift));
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar5,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  *out0 = alVar2;
  *out1 = alVar3;
  return;
}

Assistant:

static void neg_shift_avx2(const __m256i in0, const __m256i in1, __m256i *out0,
                           __m256i *out1, const __m256i *clamp_lo,
                           const __m256i *clamp_hi, int shift) {
  __m256i offset = _mm256_set1_epi32((1 << shift) >> 1);
  __m256i a0 = _mm256_add_epi32(offset, in0);
  __m256i a1 = _mm256_sub_epi32(offset, in1);

  a0 = _mm256_sra_epi32(a0, _mm_cvtsi32_si128(shift));
  a1 = _mm256_sra_epi32(a1, _mm_cvtsi32_si128(shift));

  a0 = _mm256_max_epi32(a0, *clamp_lo);
  a0 = _mm256_min_epi32(a0, *clamp_hi);
  a1 = _mm256_max_epi32(a1, *clamp_lo);
  a1 = _mm256_min_epi32(a1, *clamp_hi);

  *out0 = a0;
  *out1 = a1;
}